

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_random_dist.h
# Opt level: O1

void __thiscall PlayerRandomDist::PlayerRandomDist(PlayerRandomDist *this,string *name)

{
  pointer pcVar1;
  time_t tVar2;
  
  (this->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (this->super_Player).m_name._M_dataplus._M_p = (pointer)&(this->super_Player).m_name.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Player).m_name,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010ca88;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  return;
}

Assistant:

PlayerRandomDist(const std::string& name) :
		Player(name)
	{
		srand(time(0));
	}